

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O1

void Resmpl_Init(RESMPL_STATE *CAA)

{
  DEV_SMPL *pDVar1;
  
  if (CAA->smpRateSrc == 0) {
    CAA->resampler = (RESAMPLER_FUNC)0x0;
  }
  else {
    Resmpl_ChooseResampler(CAA);
    *(undefined4 *)((long)CAA->smplBufs + 0xc) = 0;
    *(undefined8 *)&CAA->smplBufSize = 0;
    *(undefined8 *)((long)CAA->smplBufs + 4) = 0;
    Resmpl_EnsureBuffers(CAA,CAA->smpRateSrc);
    (CAA->lSmpl).R = 0;
    CAA->smpP = 0;
    CAA->smpLast = 0;
    CAA->smpNext = 0;
    (CAA->lSmpl).L = 0;
    if (CAA->resampler == Resmpl_Exec_LinearUp) {
      (*CAA->StreamUpdate)(CAA->su_DataPtr,1,CAA->smplBufs);
      pDVar1 = CAA->smplBufs[1];
      (CAA->nSmpl).L = *CAA->smplBufs[0];
      (CAA->nSmpl).R = *pDVar1;
    }
    else {
      (CAA->nSmpl).L = 0;
      (CAA->nSmpl).R = 0;
    }
  }
  return;
}

Assistant:

void Resmpl_Init(RESMPL_STATE* CAA)
{
	if (! CAA->smpRateSrc)
	{
		CAA->resampler = NULL;
		return;
	}
	
	Resmpl_ChooseResampler(CAA);
	
	CAA->smplBufSize = 0;
	CAA->smplBufs[0] = NULL;
	CAA->smplBufs[1] = NULL;
	Resmpl_EnsureBuffers(CAA, CAA->smpRateSrc / 1); // reserve initial buffer for 1 second of samples
	
	CAA->smpP = 0x00;
	CAA->smpLast = 0x00;
	CAA->smpNext = 0x00;
	CAA->lSmpl.L = 0x00;
	CAA->lSmpl.R = 0x00;
	if (CAA->resampler == Resmpl_Exec_LinearUp)
	{
		// Pregenerate first Sample (the upsampler is always one too late)
		CAA->StreamUpdate(CAA->su_DataPtr, 1, CAA->smplBufs);
		CAA->nSmpl.L = CAA->smplBufs[0][0];
		CAA->nSmpl.R = CAA->smplBufs[1][0];
	}
	else
	{
		CAA->nSmpl.L = 0x00;
		CAA->nSmpl.R = 0x00;
	}
	
	return;
}